

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# largebuddyrange.h
# Opt level: O0

Arena<void> __thiscall
snmalloc::
LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_12UL>
::
Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>
::alloc_range(Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>
              *this,size_t size)

{
  unsigned_long uVar1;
  ulong in_RSI;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  result;
  undefined8 local_68 [4];
  void *local_48;
  size_t in_stack_ffffffffffffffc0;
  Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_63UL>
  *in_stack_ffffffffffffffd8;
  
  uVar1 = bits::mask_bits<unsigned_long,unsigned_long>(0x10e6fb);
  if (in_RSI < uVar1) {
    local_48 = (void *)Buddy<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_14UL,_63UL>
                       ::remove_block(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    local_68[0] = 0;
    if (local_48 == (void *)0x0) {
      local_48 = (void *)refill((Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>
                                 *)0x0,(size_t)local_68);
    }
  }
  else {
    local_48 = (void *)SubRange<snmalloc::PALLinux,_6UL>::
                       Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
                       ::alloc_range(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  return (Arena<void>)local_48;
}

Assistant:

capptr::Arena<void> alloc_range(size_t size)
      {
        SNMALLOC_ASSERT(size >= MIN_CHUNK_SIZE);
        SNMALLOC_ASSERT(bits::is_pow2(size));

        if (size >= bits::mask_bits(MAX_SIZE_BITS))
        {
          if (ParentRange::Aligned)
            return parent.alloc_range(size);

          return nullptr;
        }

        auto result = capptr::Arena<void>::unsafe_from(
          reinterpret_cast<void*>(buddy_large.remove_block(size)));

        if (result != nullptr)
          return result;

        return refill(size);
      }